

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::ModelProto::InternalSwap(ModelProto *this,ModelProto *other)

{
  uint32 uVar1;
  void *pvVar2;
  Rep *pRVar3;
  Rep *pRVar4;
  TrainerSpec *pTVar5;
  NormalizerSpec *pNVar6;
  NormalizerSpec *pNVar7;
  SelfTestData *pSVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar2 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_00222aa7;
LAB_00222a96:
    other_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_00222a96;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>
                         (&(other->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,other_00);
LAB_00222aa7:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  iVar10 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  iVar11 = (this->pieces_).super_RepeatedPtrFieldBase.total_size_;
  pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
  iVar9 = (other->pieces_).super_RepeatedPtrFieldBase.total_size_;
  pRVar4 = (other->pieces_).super_RepeatedPtrFieldBase.rep_;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ =
       (other->pieces_).super_RepeatedPtrFieldBase.current_size_;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = iVar9;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  (other->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
  (other->pieces_).super_RepeatedPtrFieldBase.total_size_ = iVar11;
  (other->pieces_).super_RepeatedPtrFieldBase.rep_ = pRVar3;
  pTVar5 = this->trainer_spec_;
  pNVar6 = this->normalizer_spec_;
  pNVar7 = other->normalizer_spec_;
  this->trainer_spec_ = other->trainer_spec_;
  this->normalizer_spec_ = pNVar7;
  other->trainer_spec_ = pTVar5;
  other->normalizer_spec_ = pNVar6;
  pSVar8 = this->self_test_data_;
  pNVar6 = this->denormalizer_spec_;
  pNVar7 = other->denormalizer_spec_;
  this->self_test_data_ = other->self_test_data_;
  this->denormalizer_spec_ = pNVar7;
  other->self_test_data_ = pSVar8;
  other->denormalizer_spec_ = pNVar6;
  return;
}

Assistant:

void ModelProto::InternalSwap(ModelProto* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pieces_.InternalSwap(&other->pieces_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ModelProto, denormalizer_spec_)
      + sizeof(ModelProto::denormalizer_spec_)
      - PROTOBUF_FIELD_OFFSET(ModelProto, trainer_spec_)>(
          reinterpret_cast<char*>(&trainer_spec_),
          reinterpret_cast<char*>(&other->trainer_spec_));
}